

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  U32 UVar5;
  
  iVar2 = 0x10;
  if ((size & 0xf) != 0) {
    __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xa03,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  if (-1 < (int)size) {
    iVar4 = 0;
    for (iVar3 = 0; iVar3 != (int)size / 0x10; iVar3 = iVar3 + 1) {
      for (lVar1 = (long)iVar4; iVar2 != lVar1; lVar1 = lVar1 + 1) {
        UVar5 = table[lVar1] - reducerValue;
        if (table[lVar1] < reducerValue + 2) {
          UVar5 = 0;
        }
        table[lVar1] = UVar5;
      }
      iVar2 = iVar2 + 0x10;
      iVar4 = iVar4 + 0x10;
    }
    return;
  }
  __assert_fail("size < (1U<<31)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0xa04,"void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
               );
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}